

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

ggml_backend_sched_t
ggml_backend_sched_new
          (ggml_backend_t *backends,ggml_backend_buffer_type_t *bufts,int n_backends,
          size_t graph_size,_Bool parallel)

{
  size_t __nmemb;
  _Bool _Var1;
  ggml_backend_dev_type gVar2;
  int iVar3;
  ggml_backend_sched_t pgVar4;
  char *pcVar5;
  int *piVar6;
  ggml_tensor **ppgVar7;
  long lVar8;
  size_t sVar9;
  ggml_backend_sched_split *pgVar10;
  ggml_backend_t backend;
  ggml_backend_event_t pgVar11;
  ggml_gallocr_t pgVar12;
  int iVar13;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  int c;
  int b;
  int initial_splits_capacity;
  size_t nodes_size;
  size_t ggml_sched_max_splits;
  char *GGML_SCHED_DEBUG;
  ggml_backend_sched *sched;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  size_t in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff94;
  int local_68;
  size_t local_50;
  ggml_bitset_t *local_48;
  ggml_tensor **local_40;
  
  if (in_EDX < 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
               ,0x5b0,"GGML_ASSERT(%s) failed","n_backends > 0");
  }
  if (in_EDX < 0x11) {
    ggml_backend_get_device(*(ggml_backend_t *)(in_RDI + (long)(in_EDX + -1) * 8));
    gVar2 = ggml_backend_dev_type((ggml_backend_dev_t)0x15f409);
    if (gVar2 != GGML_BACKEND_DEVICE_TYPE_CPU) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
                 ,0x5b2,"GGML_ASSERT(%s) failed",
                 "ggml_backend_dev_type(ggml_backend_get_device(backends[n_backends - 1])) == GGML_BACKEND_DEVICE_TYPE_CPU"
                );
    }
    pgVar4 = (ggml_backend_sched_t)calloc(1,0x448);
    pcVar5 = getenv("GGML_SCHED_DEBUG");
    if (pcVar5 == (char *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = atoi(pcVar5);
    }
    pgVar4->debug = iVar3;
    pgVar4->n_backends = in_EDX;
    iVar13 = 1;
    if ((in_R8B & 1) != 0) {
      iVar13 = 4;
    }
    pgVar4->n_copies = iVar13;
    ggml_hash_set_new(in_stack_ffffffffffffff80);
    (pgVar4->hash_set).size = local_50;
    (pgVar4->hash_set).used = local_48;
    (pgVar4->hash_set).keys = local_40;
    piVar6 = (int *)malloc((pgVar4->hash_set).size << 2);
    pgVar4->hv_tensor_backend_ids = piVar6;
    ppgVar7 = (ggml_tensor **)
              malloc((pgVar4->hash_set).size * (long)pgVar4->n_backends * (long)pgVar4->n_copies * 8
                    );
    pgVar4->hv_tensor_copies = ppgVar7;
    __nmemb = in_RCX * 0x15;
    piVar6 = (int *)calloc(__nmemb,4);
    pgVar4->node_backend_ids = piVar6;
    piVar6 = (int *)calloc(__nmemb,4);
    pgVar4->leaf_backend_ids = piVar6;
    piVar6 = (int *)calloc(__nmemb,4);
    pgVar4->prev_node_backend_ids = piVar6;
    piVar6 = (int *)calloc(__nmemb,4);
    pgVar4->prev_leaf_backend_ids = piVar6;
    lVar8 = in_RCX * 0x1a40;
    sVar9 = ggml_graph_overhead_custom(in_stack_ffffffffffffff80,(_Bool)in_stack_ffffffffffffff7f);
    pgVar4->context_buffer_size = lVar8 + sVar9;
    pcVar5 = (char *)malloc(pgVar4->context_buffer_size);
    pgVar4->context_buffer = pcVar5;
    pgVar10 = (ggml_backend_sched_split *)calloc(0x10,0xb8);
    pgVar4->splits = pgVar10;
    pgVar4->splits_capacity = 0x10;
    local_68 = 0;
    while( true ) {
      if (in_EDX <= local_68) {
        pgVar12 = ggml_gallocr_new_n((ggml_backend_buffer_type_t *)
                                     CONCAT44(in_stack_ffffffffffffff94,iVar3),
                                     (int)((ulong)lVar8 >> 0x20));
        pgVar4->galloc = pgVar12;
        ggml_backend_sched_reset((ggml_backend_sched_t)0x15f7f2);
        return pgVar4;
      }
      pgVar4->backends[local_68] = *(ggml_backend_t *)(in_RDI + (long)local_68 * 8);
      if (in_RSI == 0) {
        backend = (ggml_backend_t)ggml_backend_get_default_buffer_type((ggml_backend_t)0x15f6d6);
      }
      else {
        backend = *(ggml_backend_t *)(in_RSI + (long)local_68 * 8);
      }
      pgVar4->bufts[local_68] = (ggml_backend_buffer_type_t)backend;
      _Var1 = ggml_backend_supports_buft
                        (backend,(ggml_backend_buffer_type_t)
                                 CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      if (!_Var1) break;
      if (1 < pgVar4->n_copies) {
        for (in_stack_ffffffffffffff94 = 0; in_stack_ffffffffffffff94 < pgVar4->n_copies;
            in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 + 1) {
          pgVar11 = ggml_backend_event_new
                              ((ggml_backend_dev_t)
                               CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
          pgVar4->events[local_68][in_stack_ffffffffffffff94] = pgVar11;
        }
      }
      local_68 = local_68 + 1;
    }
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
               ,0x5d2,"GGML_ASSERT(%s) failed",
               "ggml_backend_supports_buft(backends[b], sched->bufts[b])");
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
             ,0x5b1,"GGML_ASSERT(%s) failed","n_backends <= GGML_SCHED_MAX_BACKENDS");
}

Assistant:

ggml_backend_sched_t ggml_backend_sched_new(
        ggml_backend_t * backends,
        ggml_backend_buffer_type_t * bufts,
        int n_backends,
        size_t graph_size,
        bool parallel) {
    GGML_ASSERT(n_backends > 0);
    GGML_ASSERT(n_backends <= GGML_SCHED_MAX_BACKENDS);
    GGML_ASSERT(ggml_backend_dev_type(ggml_backend_get_device(backends[n_backends - 1])) == GGML_BACKEND_DEVICE_TYPE_CPU);

    struct ggml_backend_sched * sched = (ggml_backend_sched *) calloc(1, sizeof(struct ggml_backend_sched));

    const char * GGML_SCHED_DEBUG = getenv("GGML_SCHED_DEBUG");
    sched->debug = GGML_SCHED_DEBUG ? atoi(GGML_SCHED_DEBUG) : 0;
    sched->n_backends = n_backends;
    sched->n_copies = parallel ? GGML_SCHED_MAX_COPIES : 1;

    // initialize hash table
    // FIXME: needs to be size*2 to account for leafs (do it in graph_split instead)
    sched->hash_set    = ggml_hash_set_new(graph_size);
    sched->hv_tensor_backend_ids = (int *) malloc(sched->hash_set.size * sizeof(sched->hv_tensor_backend_ids[0]));
    sched->hv_tensor_copies      = (ggml_tensor **) malloc(sched->hash_set.size * sched->n_backends * sched->n_copies * sizeof(struct ggml_tensor *));

    const size_t ggml_sched_max_splits = graph_size; // at most there is one split for each node in the graph
    const size_t nodes_size = graph_size + ggml_sched_max_splits*GGML_SCHED_MAX_SPLIT_INPUTS*2;
    sched->node_backend_ids = (int *) calloc(nodes_size, sizeof(sched->node_backend_ids[0]));
    sched->leaf_backend_ids = (int *) calloc(nodes_size, sizeof(sched->leaf_backend_ids[0]));
    sched->prev_node_backend_ids = (int *) calloc(nodes_size, sizeof(sched->prev_node_backend_ids[0]));
    sched->prev_leaf_backend_ids = (int *) calloc(nodes_size, sizeof(sched->prev_leaf_backend_ids[0]));

    sched->context_buffer_size = ggml_sched_max_splits*GGML_SCHED_MAX_SPLIT_INPUTS*2*sizeof(struct ggml_tensor) + ggml_graph_overhead_custom(graph_size, false);
    sched->context_buffer = (char *) malloc(sched->context_buffer_size);

    const int initial_splits_capacity = 16;
    sched->splits = (ggml_backend_sched_split *) calloc(initial_splits_capacity, sizeof(sched->splits[0]));
    sched->splits_capacity = initial_splits_capacity;

    for (int b = 0; b < n_backends; b++) {
        sched->backends[b] = backends[b];
        sched->bufts[b] = bufts ? bufts[b] : ggml_backend_get_default_buffer_type(backends[b]);
        GGML_ASSERT(ggml_backend_supports_buft(backends[b], sched->bufts[b]));

        if (sched->n_copies > 1) {
            for (int c = 0; c < sched->n_copies; c++) {
                sched->events[b][c] = ggml_backend_event_new(backends[b]->device);
            }
        }
    }

    sched->galloc = ggml_gallocr_new_n(sched->bufts, n_backends);

    ggml_backend_sched_reset(sched);

    return sched;
}